

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_partition_iterator.h
# Opt level: O2

void __thiscall
Gudhi::coxeter_triangulation::Set_partition_iterator::increment(Set_partition_iterator *this)

{
  uint *puVar1;
  pointer puVar2;
  pointer puVar3;
  uint uVar4;
  pointer *ppuVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 uStack_18;
  
  if (1 < this->k_) {
    puVar2 = (this->rgs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->max_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uStack_18 = (ulong)this->n_;
    do {
      do {
        uVar7 = uStack_18;
        uVar4 = (int)uVar7 - 1;
        uStack_18 = (ulong)uVar4;
        uVar6 = puVar2[uStack_18] + 1;
      } while (this->k_ <= uVar6);
    } while (puVar3[uStack_18] < uVar6);
    if (uVar4 != 0) {
      puVar2[uStack_18] = uVar6;
      uVar4 = (puVar3[uStack_18] + 1) - (uint)(uVar6 < puVar3[uStack_18]);
      for (; puVar3[uVar7] = uVar4, (uint)uVar7 < this->n_; uVar7 = uVar7 + 1) {
        puVar2[uVar7] = 0;
        uStack_18 = (ulong)((int)uStack_18 + 1);
      }
      uVar6 = this->k_;
      if (uVar4 < uVar6) {
        do {
          puVar3[(int)uStack_18 + 1] = uVar6;
          uVar6 = uVar6 - 1;
          puVar2[uStack_18] = uVar6;
          puVar1 = puVar3 + uStack_18;
          uStack_18 = (ulong)((int)uStack_18 - 1);
        } while (*puVar1 < uVar6);
        update_value(this);
        return;
      }
      uVar4 = this->k_;
      ppuVar5 = (pointer *)
                ((long)&(((this->value_).
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl + 8
                );
      for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
        if (*ppuVar5 != ((_Vector_impl_data *)(ppuVar5 + -1))->_M_start) {
          *ppuVar5 = ((_Vector_impl_data *)(ppuVar5 + -1))->_M_start;
        }
        ppuVar5 = ppuVar5 + 3;
      }
      uVar4 = 0;
      while (uStack_18 = CONCAT44(uVar4,(undefined4)uStack_18), uVar4 < this->n_) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((this->value_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   (this->rgs_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar4],
                   (value_type_conflict3 *)((long)&uStack_18 + 4));
        uVar4 = uStack_18._4_4_ + 1;
      }
      return;
    }
  }
  this->is_end_ = true;
  return;
}

Assistant:

void increment() {
    if (k_ <= 1) {
      is_end_ = true;
      return;
    }
    uint i = n_ - 1;
    while (rgs_[i] + 1 > max_[i] || rgs_[i] + 1 >= k_) i--;
    if (i == 0) {
      is_end_ = true;
      return;
    }
    rgs_[i]++;
    uint mm = max_[i];
    mm += (rgs_[i] >= mm);
    max_[i + 1] = mm;
    while (++i < n_) {
      rgs_[i] = 0;
      max_[i + 1] = mm;
    }
    uint p = k_;
    if (mm < p) do {
        max_[i] = p;
        --i;
        --p;
        rgs_[i] = p;
      } while (max_[i] < p);
    update_value();
  }